

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_cons_viscous_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,REF_DBL re,
          REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_4;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT zz;
  REF_INT yz;
  REF_INT yy;
  REF_INT xz;
  REF_INT xy;
  REF_INT xx;
  REF_DBL frhoe;
  REF_DBL frhou3;
  REF_DBL frhou2;
  REF_DBL frhou1;
  REF_DBL mu_t;
  REF_DBL turb;
  REF_DBL rho;
  REF_DBL thermal_conductivity;
  REF_DBL turbulent_pr;
  REF_DBL pr;
  REF_DBL e;
  REF_DBL q2;
  REF_DBL u3;
  REF_DBL u2;
  REF_DBL u1;
  REF_DBL mu;
  REF_DBL t;
  REF_DBL gamma;
  REF_DBL *rhoestar;
  REF_DBL *rhou3star;
  REF_DBL *rhou2star;
  REF_DBL *rhou1star;
  REF_DBL *lam;
  int local_60;
  REF_INT nequ;
  REF_INT node;
  REF_INT var;
  REF_NODE ref_node;
  REF_DBL RStack_48;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL reference_temp_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_DBL *prim_dual_local;
  REF_GRID pRStack_20;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  REF_DBL *g_local;
  
  _node = ref_grid->node;
  t = 1.4;
  turbulent_pr = 0.72;
  thermal_conductivity = 0.9;
  lam._4_4_ = ldim / 2;
  ref_node._4_4_ = reconstruction;
  RStack_48 = reference_temp;
  reference_temp_local = re;
  re_local = mach;
  mach_local = (REF_DBL)prim_dual;
  prim_dual_local._4_4_ = ldim;
  pRStack_20 = ref_grid;
  ref_grid_local = (REF_GRID)g;
  if (_node->max * 6 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbca,
           "ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL negative");
    g_local._4_4_ = 1;
  }
  else {
    rhou2star = (REF_DBL *)malloc((long)(_node->max * 6) << 3);
    if (rhou2star == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbca,"ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL NULL");
      g_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0;
          SBORROW4(ref_malloc_init_i_2,_node->max * 6) != ref_malloc_init_i_2 + _node->max * -6 < 0;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        rhou2star[ref_malloc_init_i_2] = 0.0;
      }
      if (_node->max * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xbcb,"ref_metric_cons_viscous_g","malloc rhou2star of REF_DBL negative");
        g_local._4_4_ = 1;
      }
      else {
        rhou3star = (REF_DBL *)malloc((long)(_node->max * 6) << 3);
        if (rhou3star == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xbcb,"ref_metric_cons_viscous_g","malloc rhou2star of REF_DBL NULL");
          g_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0;
              SBORROW4(ref_malloc_init_i_3,_node->max * 6) !=
              ref_malloc_init_i_3 + _node->max * -6 < 0;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            rhou3star[ref_malloc_init_i_3] = 0.0;
          }
          if (_node->max * 6 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xbcc,"ref_metric_cons_viscous_g","malloc rhou3star of REF_DBL negative");
            g_local._4_4_ = 1;
          }
          else {
            rhoestar = (REF_DBL *)malloc((long)(_node->max * 6) << 3);
            if (rhoestar == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xbcc,"ref_metric_cons_viscous_g","malloc rhou3star of REF_DBL NULL");
              g_local._4_4_ = 2;
            }
            else {
              for (ref_malloc_init_i_4 = 0;
                  SBORROW4(ref_malloc_init_i_4,_node->max * 6) !=
                  ref_malloc_init_i_4 + _node->max * -6 < 0;
                  ref_malloc_init_i_4 = ref_malloc_init_i_4 + 1) {
                rhoestar[ref_malloc_init_i_4] = 0.0;
              }
              if (_node->max * 6 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xbcd,"ref_metric_cons_viscous_g","malloc rhoestar of REF_DBL negative");
                g_local._4_4_ = 1;
              }
              else {
                gamma = (REF_DBL)malloc((long)(_node->max * 6) << 3);
                if ((void *)gamma == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xbcd,"ref_metric_cons_viscous_g","malloc rhoestar of REF_DBL NULL");
                  g_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss = 0;
                      SBORROW4(ref_private_macro_code_rss,_node->max * 6) !=
                      ref_private_macro_code_rss + _node->max * -6 < 0;
                      ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                    *(undefined8 *)((long)gamma + (long)ref_private_macro_code_rss * 8) = 0;
                  }
                  if (_node->max < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xbce,"ref_metric_cons_viscous_g","malloc lam of REF_DBL negative");
                    g_local._4_4_ = 1;
                  }
                  else {
                    rhou1star = (REF_DBL *)malloc((long)_node->max << 3);
                    if (rhou1star == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xbce,"ref_metric_cons_viscous_g","malloc lam of REF_DBL NULL");
                      g_local._4_4_ = 2;
                    }
                    else {
                      for (ref_private_macro_code_rss_1 = 0;
                          ref_private_macro_code_rss_1 < _node->max;
                          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                        rhou1star[ref_private_macro_code_rss_1] = 0.0;
                      }
                      nequ = 1;
                      for (local_60 = 0; local_60 < _node->max; local_60 = local_60 + 1) {
                        if (((-1 < local_60) && (local_60 < _node->max)) &&
                           (-1 < _node->global[local_60])) {
                          rhou1star[local_60] =
                               *(REF_DBL *)
                                ((long)mach_local +
                                (long)(lam._4_4_ + 1 + prim_dual_local._4_4_ * local_60) * 8);
                        }
                      }
                      uVar1 = ref_recon_signed_hessian
                                        (pRStack_20,rhou1star,rhou2star,ref_node._4_4_);
                      if (uVar1 == 0) {
                        nequ = 2;
                        for (local_60 = 0; local_60 < _node->max; local_60 = local_60 + 1) {
                          if (((-1 < local_60) && (local_60 < _node->max)) &&
                             (-1 < _node->global[local_60])) {
                            rhou1star[local_60] =
                                 *(REF_DBL *)
                                  ((long)mach_local +
                                  (long)(lam._4_4_ + 2 + prim_dual_local._4_4_ * local_60) * 8);
                          }
                        }
                        uVar1 = ref_recon_signed_hessian
                                          (pRStack_20,rhou1star,rhou3star,ref_node._4_4_);
                        if (uVar1 == 0) {
                          nequ = 3;
                          for (local_60 = 0; local_60 < _node->max; local_60 = local_60 + 1) {
                            if (((-1 < local_60) && (local_60 < _node->max)) &&
                               (-1 < _node->global[local_60])) {
                              rhou1star[local_60] =
                                   *(REF_DBL *)
                                    ((long)mach_local +
                                    (long)(lam._4_4_ + 3 + prim_dual_local._4_4_ * local_60) * 8);
                            }
                          }
                          uVar1 = ref_recon_signed_hessian
                                            (pRStack_20,rhou1star,rhoestar,ref_node._4_4_);
                          if (uVar1 == 0) {
                            nequ = 4;
                            for (local_60 = 0; local_60 < _node->max; local_60 = local_60 + 1) {
                              if (((-1 < local_60) && (local_60 < _node->max)) &&
                                 (-1 < _node->global[local_60])) {
                                rhou1star[local_60] =
                                     *(REF_DBL *)
                                      ((long)mach_local +
                                      (long)(lam._4_4_ + 4 + prim_dual_local._4_4_ * local_60) * 8);
                              }
                            }
                            uVar1 = ref_recon_signed_hessian
                                              (pRStack_20,rhou1star,(REF_DBL *)gamma,ref_node._4_4_)
                            ;
                            if (uVar1 == 0) {
                              if (rhou1star != (REF_DBL *)0x0) {
                                free(rhou1star);
                              }
                              for (local_60 = 0; local_60 < _node->max; local_60 = local_60 + 1) {
                                if (((-1 < local_60) && (local_60 < _node->max)) &&
                                   (-1 < _node->global[local_60])) {
                                  turb = *(double *)
                                          ((long)mach_local +
                                          (long)(prim_dual_local._4_4_ * local_60) * 8);
                                  u2 = *(double *)
                                        ((long)mach_local +
                                        (long)(prim_dual_local._4_4_ * local_60 + 1) * 8);
                                  u3 = *(double *)
                                        ((long)mach_local +
                                        (long)(prim_dual_local._4_4_ * local_60 + 2) * 8);
                                  q2 = *(double *)
                                        ((long)mach_local +
                                        (long)(prim_dual_local._4_4_ * local_60 + 3) * 8);
                                  e = q2 * q2 + u2 * u2 + u3 * u3;
                                  pr = turb * 0.5 * e +
                                       *(double *)
                                        ((long)mach_local +
                                        (long)(prim_dual_local._4_4_ * local_60 + 4) * 8) /
                                       (t - 1.0);
                                  mu = (t * *(double *)
                                             ((long)mach_local +
                                             (long)(prim_dual_local._4_4_ * local_60 + 4) * 8)) /
                                       *(double *)
                                        ((long)mach_local +
                                        (long)(prim_dual_local._4_4_ * local_60) * 8);
                                  uVar1 = viscosity_law(mu,RStack_48,&u1);
                                  if (uVar1 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                           ,0xbee,"ref_metric_cons_viscous_g",(ulong)uVar1,
                                           "sutherlands");
                                    return uVar1;
                                  }
                                  rho = u1 / (turbulent_pr * (t - 1.0));
                                  if (lam._4_4_ == 6) {
                                    mu_t = *(REF_DBL *)
                                            ((long)mach_local +
                                            (long)(prim_dual_local._4_4_ * local_60 + 5) * 8);
                                    uVar1 = ref_phys_mut_sa(mu_t,turb,u1 / turb,&frhou1);
                                    if (uVar1 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                             ,0xbf2,"ref_metric_cons_viscous_g",(ulong)uVar1,
                                             "eddy viscosity");
                                      return uVar1;
                                    }
                                    rho = u1 / (turbulent_pr * (t - 1.0)) +
                                          frhou1 / (thermal_conductivity * (t - 1.0));
                                    u1 = frhou1 + u1;
                                  }
                                  u1 = (re_local / reference_temp_local) * u1;
                                  rho = (re_local / reference_temp_local) * rho;
                                  dVar3 = ((u1 * 0.3333333333333333) / turb) *
                                          (q2 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 2) * 8) +
                                           u3 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 1) * 8) +
                                           u2 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 5) * 8) +
                                           u2 * 4.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6) * 8) +
                                           u2 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 3) * 8) +
                                          rhou2star[local_60 * 6 + 5] * 3.0 +
                                          rhou2star[local_60 * 6] * 4.0 +
                                          rhou2star[local_60 * 6 + 3] * 3.0 +
                                          rhou3star[local_60 * 6 + 1] + rhoestar[local_60 * 6 + 2]);
                                  dVar4 = ((u1 * 0.3333333333333333) / turb) *
                                          (q2 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 4) * 8) +
                                           u3 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 5) * 8) +
                                           u3 * 4.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 3) * 8) +
                                           u2 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 1) * 8) +
                                           u3 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6) * 8) +
                                          rhou3star[local_60 * 6 + 5] * 3.0 +
                                          rhou3star[local_60 * 6 + 3] * 4.0 +
                                          rhou3star[local_60 * 6] * 3.0 +
                                          rhou2star[local_60 * 6 + 1] + rhoestar[local_60 * 6 + 4]);
                                  dVar5 = ((u1 * 0.3333333333333333) / turb) *
                                          (q2 * 4.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 5) * 8) +
                                           q2 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 3) * 8) +
                                           q2 * 3.0 *
                                           *(double *)((long)gamma + (long)(local_60 * 6) * 8) +
                                           u2 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 2) * 8) +
                                           u3 * *(double *)
                                                 ((long)gamma + (long)(local_60 * 6 + 4) * 8) +
                                          rhoestar[local_60 * 6 + 5] * 4.0 +
                                          rhoestar[local_60 * 6 + 3] * 3.0 +
                                          rhoestar[local_60 * 6] * 3.0 +
                                          rhou2star[local_60 * 6 + 2] + rhou3star[local_60 * 6 + 4])
                                  ;
                                  dVar6 = (rho / turb) *
                                          (*(double *)((long)gamma + (long)(local_60 * 6) * 8) +
                                           *(double *)((long)gamma + (long)(local_60 * 6 + 3) * 8) +
                                          *(double *)((long)gamma + (long)(local_60 * 6 + 5) * 8));
                                  ref_grid_local->cell[(long)(local_60 * 5) + -2] =
                                       (REF_CELL)
                                       ((e - pr / turb) * dVar6 +
                                        -q2 * dVar5 + -u2 * dVar3 + -(u3 * dVar4) +
                                       (double)ref_grid_local->cell[(long)(local_60 * 5) + -2]);
                                  lVar2 = (long)(local_60 * 5 + 1);
                                  ref_grid_local->cell[lVar2 + -2] =
                                       (REF_CELL)
                                       (-u2 * dVar6 + dVar3 +
                                       (double)ref_grid_local->cell[lVar2 + -2]);
                                  lVar2 = (long)(local_60 * 5 + 2);
                                  ref_grid_local->cell[lVar2 + -2] =
                                       (REF_CELL)
                                       (-u3 * dVar6 + dVar4 +
                                       (double)ref_grid_local->cell[lVar2 + -2]);
                                  lVar2 = (long)(local_60 * 5 + 3);
                                  ref_grid_local->cell[lVar2 + -2] =
                                       (REF_CELL)
                                       (-q2 * dVar6 + dVar5 +
                                       (double)ref_grid_local->cell[lVar2 + -2]);
                                  lVar2 = (long)(local_60 * 5 + 4);
                                  ref_grid_local->cell[lVar2 + -2] =
                                       (REF_CELL)(dVar6 + (double)ref_grid_local->cell[lVar2 + -2]);
                                }
                              }
                              if (gamma != 0.0) {
                                free((void *)gamma);
                              }
                              if (rhoestar != (REF_DBL *)0x0) {
                                free(rhoestar);
                              }
                              if (rhou3star != (REF_DBL *)0x0) {
                                free(rhou3star);
                              }
                              if (rhou2star != (REF_DBL *)0x0) {
                                free(rhou2star);
                              }
                              g_local._4_4_ = 0;
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0xbe3,"ref_metric_cons_viscous_g",(ulong)uVar1,"h4");
                              g_local._4_4_ = uVar1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0xbde,"ref_metric_cons_viscous_g",(ulong)uVar1,"h3");
                            g_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                 ,0xbd9,"ref_metric_cons_viscous_g",(ulong)uVar1,"h2");
                          g_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xbd4,"ref_metric_cons_viscous_g",(ulong)uVar1,"h1");
                        g_local._4_4_ = uVar1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return g_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_viscous_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node;
  REF_INT nequ;
  REF_DBL *lam, *rhou1star, *rhou2star, *rhou3star, *rhoestar;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu, u1, u2, u3, q2, e;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;
  REF_DBL frhou1, frhou2, frhou3, frhoe;
  REF_INT xx = 0, xy = 1, xz = 2, yy = 3, yz = 4, zz = 5;

  nequ = ldim / 2;

  ref_malloc_init(rhou1star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou2star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou3star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhoestar, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);

  var = 1;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou1star, reconstruction), "h1");
  var = 2;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou2star, reconstruction), "h2");
  var = 3;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou3star, reconstruction), "h3");
  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhoestar, reconstruction), "h4");
  ref_free(lam);

  each_ref_node_valid_node(ref_node, node) {
    rho = prim_dual[0 + ldim * node];
    u1 = prim_dual[1 + ldim * node];
    u2 = prim_dual[2 + ldim * node];
    u3 = prim_dual[3 + ldim * node];
    q2 = u1 * u1 + u2 * u2 + u3 * u3;
    e = prim_dual[4 + ldim * node] / (gamma - 1.0) + 0.5 * rho * q2;
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    mu *= mach / re;
    thermal_conductivity *= mach / re;

    frhou1 = 4.0 * rhou1star[xx + 6 * node] + 3.0 * rhou1star[yy + 6 * node] +
             3.0 * rhou1star[zz + 6 * node] + rhou2star[xy + 6 * node] +
             rhou3star[xz + 6 * node];
    frhou1 += 4.0 * u1 * rhoestar[xx + 6 * node] +
              3.0 * u1 * rhoestar[yy + 6 * node] +
              3.0 * u1 * rhoestar[zz + 6 * node] +
              u2 * rhoestar[xy + 6 * node] + u3 * rhoestar[xz + 6 * node];
    frhou1 *= (1.0 / 3.0) * mu / rho;

    frhou2 = rhou1star[xy + 6 * node] + 3.0 * rhou2star[xx + 6 * node] +
             4.0 * rhou2star[yy + 6 * node] + 3.0 * rhou2star[zz + 6 * node] +
             rhou3star[yz + 6 * node];
    frhou2 += u1 * rhoestar[xy + 6 * node] +
              3.0 * u2 * rhoestar[xx + 6 * node] +
              4.0 * u2 * rhoestar[yy + 6 * node] +
              3.0 * u2 * rhoestar[zz + 6 * node] + u3 * rhoestar[yz + 6 * node];
    frhou2 *= (1.0 / 3.0) * mu / rho;

    frhou3 = rhou1star[xz + 6 * node] + rhou2star[yz + 6 * node] +
             3.0 * rhou3star[xx + 6 * node] + 3.0 * rhou3star[yy + 6 * node] +
             4.0 * rhou3star[zz + 6 * node];
    frhou3 += u1 * rhoestar[xz + 6 * node] + u2 * rhoestar[yz + 6 * node] +
              3.0 * u3 * rhoestar[xx + 6 * node] +
              3.0 * u3 * rhoestar[yy + 6 * node] +
              4.0 * u3 * rhoestar[zz + 6 * node];
    frhou3 *= (1.0 / 3.0) * mu / rho;

    frhoe = rhoestar[xx + 6 * node] + rhoestar[yy + 6 * node] +
            rhoestar[zz + 6 * node];
    frhoe *= thermal_conductivity / rho;
    /* fun3d e has density in it */
    g[0 + 5 * node] +=
        -u1 * frhou1 - u2 * frhou2 - u3 * frhou3 + (q2 - e / rho) * frhoe;
    g[1 + 5 * node] += frhou1 - u1 * frhoe;
    g[2 + 5 * node] += frhou2 - u2 * frhoe;
    g[3 + 5 * node] += frhou3 - u3 * frhoe;
    g[4 + 5 * node] += frhoe;
  }

  ref_free(rhoestar);
  ref_free(rhou3star);
  ref_free(rhou2star);
  ref_free(rhou1star);

  return REF_SUCCESS;
}